

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkRestrash(Abc_Ntk_t *pNtk,int fCleanup)

{
  Abc_Aig_t *pMan;
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *p1;
  Abc_Ntk_t *pAVar3;
  int local_3c;
  int nNodes;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkAig;
  Vec_Ptr_t *vNodes;
  int fCleanup_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 != 0) {
    iVar1 = Abc_NtkGetChoiceNum(pNtk);
    if (iVar1 != 0) {
      printf("Warning: The choice nodes in the original AIG are removed by strashing.\n");
    }
    pNtk_local = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    p = Abc_NtkDfs(pNtk,0);
    for (local_3c = 0; iVar1 = Vec_PtrSize(p), local_3c < iVar1; local_3c = local_3c + 1) {
      pObj_00 = (Abc_Obj_t *)Vec_PtrEntry(p,local_3c);
      pMan = (Abc_Aig_t *)pNtk_local->pManFunc;
      pAVar2 = Abc_ObjChild0Copy(pObj_00);
      p1 = Abc_ObjChild1Copy(pObj_00);
      pAVar2 = Abc_AigAnd(pMan,pAVar2,p1);
      (pObj_00->field_6).pCopy = pAVar2;
    }
    Vec_PtrFree(p);
    Abc_NtkFinalize(pNtk,pNtk_local);
    if (fCleanup != 0) {
      Abc_AigCleanup((Abc_Aig_t *)pNtk_local->pManFunc);
    }
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar3 = Abc_NtkDup(pNtk->pExdc);
      pNtk_local->pExdc = pAVar3;
    }
    iVar1 = Abc_NtkCheck(pNtk_local);
    if (iVar1 == 0) {
      printf("Abc_NtkStrash: The network check has failed.\n");
      Abc_NtkDelete(pNtk_local);
      pNtk_local = (Abc_Ntk_t *)0x0;
    }
    return pNtk_local;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                ,0x38,"Abc_Ntk_t *Abc_NtkRestrash(Abc_Ntk_t *, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkRestrash( Abc_Ntk_t * pNtk, int fCleanup )
{
//    extern int timeRetime;
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkAig;
    Abc_Obj_t * pObj;
    int i, nNodes;//, RetValue;
    assert( Abc_NtkIsStrash(pNtk) );
//timeRetime = Abc_Clock();
    // print warning about choice nodes
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Warning: The choice nodes in the original AIG are removed by strashing.\n" );
    // start the new network (constants and CIs of the old network will point to the their counterparts in the new network)
    pNtkAig = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // restrash the nodes (assuming a topological order of the old network)
    vNodes = Abc_NtkDfs( pNtk, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkAig->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    Vec_PtrFree( vNodes );
    // finalize the network
    Abc_NtkFinalize( pNtk, pNtkAig );
    // print warning about self-feed latches
//    if ( Abc_NtkCountSelfFeedLatches(pNtkAig) )
//        printf( "Warning: The network has %d self-feeding latches.\n", Abc_NtkCountSelfFeedLatches(pNtkAig) );
    // perform cleanup if requested
    if ( fCleanup && (nNodes = Abc_AigCleanup((Abc_Aig_t *)pNtkAig->pManFunc)) ) 
    {
//        printf( "Abc_NtkRestrash(): AIG cleanup removed %d nodes (this is a bug).\n", nNodes );
    }
    // duplicate EXDC 
    if ( pNtk->pExdc )
        pNtkAig->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkStrash: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
//timeRetime = Abc_Clock() - timeRetime;
//    if ( RetValue = Abc_NtkRemoveSelfFeedLatches(pNtkAig) )
//        printf( "Modified %d self-feeding latches. The result may not verify.\n", RetValue );
    return pNtkAig;

}